

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata.cc
# Opt level: O3

bool libaom_examples::double_to_depth_representation_element
               (double v,DepthRepresentationElement *element)

{
  int iVar1;
  uint32_t uVar2;
  byte bVar3;
  byte bVar4;
  double orig;
  double dVar5;
  double dVar6;
  double dVar7;
  
  if ((v == 0.0) && (!NAN(v))) {
    element->sign_flag = false;
    element->exponent = '\0';
    element->mantissa_len = '\0';
    element->mantissa = 1;
    return true;
  }
  dVar5 = -v;
  dVar6 = dVar5;
  if (dVar5 <= v) {
    dVar6 = v;
  }
  if (1.0 <= dVar6) {
    if (dVar6 < 2.0) goto LAB_00125620;
    iVar1 = 0;
    do {
      iVar1 = iVar1 + 1;
      dVar6 = dVar6 * 0.5;
    } while (2.0 <= dVar6);
  }
  else {
    if (1.0 <= dVar6) {
LAB_00125620:
      iVar1 = 0;
      goto LAB_0012564a;
    }
    iVar1 = 0;
    do {
      dVar6 = dVar6 + dVar6;
      iVar1 = iVar1 + -1;
    } while (dVar6 < 1.0);
  }
  if (iVar1 - 0x60U < 0xffffff82) {
    fprintf(_stderr,"Error: Floating point value %f out of range (too large or too small)\n");
    return false;
  }
LAB_0012564a:
  dVar6 = dVar6 + -1.0;
  uVar2 = 0;
  bVar3 = 0;
  do {
    dVar7 = 0.5;
    if (0.5 > dVar6) {
      dVar7 = 0.0;
    }
    uVar2 = (uint)(0.5 <= dVar6) + uVar2 * 2;
    bVar4 = bVar3 + 1;
  } while ((bVar3 < 0x1f) && (dVar6 = (dVar6 - dVar7) + (dVar6 - dVar7), bVar3 = bVar4, 0.0 < dVar6)
          );
  element->sign_flag = v < dVar5;
  element->exponent = (char)iVar1 + '\x1f';
  element->mantissa_len = bVar4;
  element->mantissa = uVar2;
  return true;
}

Assistant:

bool double_to_depth_representation_element(
    double v, DepthRepresentationElement *element) {
  const double orig = v;
  if (v == 0.0) {
    *element = { 0, 0, 0, 1 };
    return true;
  }
  const bool sign = v < 0.0;
  if (sign) {
    v = -v;
  }
  int exp = 0;
  if (v >= 1.0) {
    while (v >= 2.0) {
      ++exp;
      v /= 2;
    }
  } else {
    while (v < 1.0) {
      ++exp;
      v *= 2.0;
    }
    exp = -exp;
  }
  if ((exp + 31) <= 0 || (exp + 31) > 126) {
    fprintf(stderr,
            "Error: Floating point value %f out of range (too large or too "
            "small)\n",
            orig);
    return false;
  }
  assert(v >= 1.0 && v < 2.0);
  v -= 1.0;
  uint32_t mantissa = 0;
  uint8_t mantissa_len = 0;
  constexpr uint8_t kMaxMantissaLen = 32;
  do {
    const int bit = (v >= 0.5);
    mantissa = (mantissa << 1) + bit;
    v -= bit * 0.5;
    ++mantissa_len;
    v *= 2.0;
  } while (mantissa_len < kMaxMantissaLen && v > 0.0);
  *element = { sign, static_cast<uint8_t>(exp + 31), mantissa_len, mantissa };
  return true;
}